

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O1

int64_t duckdb_nanoarrow::ArrowMetadataSizeOf(char *metadata)

{
  long lVar1;
  int64_t iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  if (metadata == (char *)0x0) {
    iVar2 = 0;
  }
  else {
    lVar3 = 4;
    iVar2 = 4;
    for (iVar5 = *(int *)metadata; 0 < iVar5; iVar5 = iVar5 + -1) {
      lVar4 = (long)*(int *)(metadata + lVar3);
      lVar1 = lVar4 + 4 + lVar3;
      lVar3 = lVar3 + lVar4 + (long)*(int *)(metadata + lVar1) + 8;
      iVar2 = iVar2 + lVar4 + (long)*(int *)(metadata + lVar1) + 8;
    }
  }
  return iVar2;
}

Assistant:

int64_t ArrowMetadataSizeOf(const char *metadata) {
	if (metadata == NULL) {
		return 0;
	}

	struct ArrowMetadataReader reader;
	struct ArrowStringView key;
	struct ArrowStringView value;
	ArrowMetadataReaderInit(&reader, metadata);

	int64_t size = sizeof(int32_t);
	while (ArrowMetadataReaderRead(&reader, &key, &value) == NANOARROW_OK) {
		size += sizeof(int32_t) + uint64_t(key.n_bytes) + sizeof(int32_t) + uint64_t(value.n_bytes);
	}

	return size;
}